

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  KeyInfo *pKVar1;
  undefined1 *puVar2;
  u8 uVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  Mem *pMem2;
  char *__s2;
  uint uVar13;
  ulong v;
  ulong uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  ulong local_b0;
  uint local_7c;
  MemValue local_78;
  undefined1 *local_70;
  undefined8 uStack_68;
  sqlite3 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  u32 s1;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMem2 = pPKey2->aMem;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  if (bSkip == 0) {
    s1 = (u32)*pKey1;
    if ((char)*pKey1 < '\0') {
      bVar4 = sqlite3GetVarint32((uchar *)pKey1,&s1);
      uVar11 = (uint)bVar4;
    }
    else {
      uVar11 = 1;
    }
    local_b0 = 0;
    uVar15 = s1;
    uVar9 = s1;
  }
  else {
    s1 = (u32)*(byte *)((long)pKey1 + 1);
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar3 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),&s1);
      uVar11 = (uint)(byte)(uVar3 + 1);
    }
    else {
      uVar11 = 2;
    }
    if (s1 < 0x80) {
      uVar15 = (uint)""[s1];
    }
    else {
      uVar15 = s1 - 0xc >> 1;
    }
    pMem2 = pMem2 + 1;
    local_b0 = 1;
    uVar15 = uVar15 + *pKey1;
    uVar9 = (uint)*pKey1;
  }
  if (uVar15 <= (uint)nKey1) {
    local_78.i = -1;
    do {
      uVar5 = pMem2->flags;
      uVar7 = (ulong)uVar11;
      uVar14 = (ulong)uVar15;
      if ((uVar5 & 0x24) == 0) {
        if ((uVar5 & 8) != 0) {
          bVar4 = *(byte *)((long)pKey1 + uVar7);
          v = (ulong)bVar4;
          if (9 < bVar4) goto LAB_0014b007;
          if (bVar4 != 7) {
            uVar13 = (uint)bVar4;
            if (bVar4 != 0) {
              sqlite3VdbeSerialGet((uchar *)(uVar14 + (long)pKey1),(uint)bVar4,(Mem *)&local_78);
              uVar13 = sqlite3IntFloatCompare(local_78.i,(pMem2->u).r);
              goto LAB_0014af78;
            }
            goto LAB_0014b023;
          }
          iVar6 = serialGet7((uchar *)(uVar14 + (long)pKey1),(Mem *)&local_78);
          if (iVar6 != 0) {
            uVar13 = 1;
            goto LAB_0014b023;
          }
          if ((pMem2->u).r <= local_78.r) {
            v = 7;
            if ((pMem2->u).r < local_78.r) goto LAB_0014b043;
            goto LAB_0014af80;
          }
          uVar13 = 1;
          goto LAB_0014b05c;
        }
        if ((uVar5 & 2) == 0) {
          bVar4 = *(byte *)((long)pKey1 + uVar7);
          v = (ulong)bVar4;
          uVar10 = (uint)bVar4;
          uVar13 = (uint)bVar4;
          if ((uVar5 & 0x10) == 0) {
            if ((uVar13 != 0) && (bVar4 != 10)) {
              if (bVar4 == 7) {
                iVar6 = serialGet7((uchar *)(uVar14 + (long)pKey1),(Mem *)&local_78);
                v = 7;
                if (iVar6 != 0) goto LAB_0014af80;
LAB_0014b043:
                uVar10 = 1;
                uVar12 = uVar10;
              }
              else {
                uVar12 = 1;
              }
              goto LAB_0014b05f;
            }
            goto LAB_0014af80;
          }
          local_7c = uVar13;
          if ((char)bVar4 < '\0') {
            sqlite3GetVarint32((uchar *)(uVar7 + (long)pKey1),&local_7c);
            v = (ulong)local_7c;
          }
          uVar13 = (uint)v;
          if ((uVar13 < 0xc) || ((v & 1) != 0)) goto LAB_0014b023;
          uVar10 = uVar13 - 0xc >> 1;
          if (uVar10 + uVar15 <= (uint)nKey1) {
            if ((pMem2->flags & 0x400) != 0) {
              iVar6 = isAllZero((char *)(uVar14 + (long)pKey1),uVar10);
              if (iVar6 != 0) {
                uVar13 = uVar10 - (pMem2->u).nZero;
                goto LAB_0014af78;
              }
              goto LAB_0014b038;
            }
            uVar12 = pMem2->n;
            uVar13 = uVar10 - uVar12;
            if ((int)uVar10 < (int)uVar12) {
              uVar12 = uVar10;
            }
            __s2 = pMem2->z;
            goto LAB_0014af35;
          }
          iVar6 = 0x15f6d;
        }
        else {
          bVar4 = *(byte *)((long)pKey1 + uVar7);
          v = (ulong)bVar4;
          local_7c = (uint)bVar4;
          if ((char)bVar4 < '\0') {
            sqlite3GetVarint32((uchar *)(uVar7 + (long)pKey1),&local_7c);
            v = (ulong)local_7c;
          }
          puVar2 = uStack_68;
          uVar13 = (uint)v;
          if (uVar13 < 0xc) {
LAB_0014b023:
            uVar10 = uVar13;
            uVar12 = 0xffffffff;
            goto LAB_0014b05f;
          }
          if ((v & 1) == 0) {
LAB_0014b038:
            uVar10 = 1;
            uVar12 = uVar10;
            goto LAB_0014b05f;
          }
          uVar10 = uVar13 - 0xc >> 1;
          uStack_68 = (undefined1 *)CONCAT44(uStack_68._4_4_,uVar10);
          if ((uVar10 + uVar15 <= (uint)nKey1) &&
             (pKVar1 = pPKey2->pKeyInfo, local_b0 < pKVar1->nAllField)) {
            if (pKVar1->aColl[local_b0] != (CollSeq *)0x0) {
              uStack_68._7_1_ = SUB81(puVar2,7);
              local_60 = pKVar1->db;
              uStack_68 = (undefined1 *)
                          CONCAT26(CONCAT11(uStack_68._7_1_,pKVar1->enc),CONCAT24(2,uVar10));
              local_70 = (undefined1 *)(uVar14 + (long)pKey1);
              uVar13 = vdbeCompareMemString
                                 ((Mem *)&local_78,pMem2,pKVar1->aColl[local_b0],&pPKey2->errCode);
              goto LAB_0014af78;
            }
            uVar12 = pMem2->n;
            uVar13 = uVar10 - uVar12;
            if ((int)uVar10 < (int)uVar12) {
              uVar12 = uVar10;
            }
            __s2 = pMem2->z;
LAB_0014af35:
            uVar12 = memcmp((void *)(uVar14 + (long)pKey1),__s2,(long)(int)uVar12);
            if (uVar12 == 0) goto LAB_0014af78;
            uVar10 = 1;
            goto LAB_0014b05f;
          }
          iVar6 = 0x15f4f;
        }
        goto LAB_0014aff6;
      }
      bVar4 = *(byte *)((long)pKey1 + uVar7);
      v = (ulong)bVar4;
      uVar10 = (uint)bVar4;
      if (9 < bVar4) {
LAB_0014b007:
        uVar12 = (uint)(bVar4 != 10) * 2 - 1;
        bVar16 = false;
        goto LAB_0014b065;
      }
      if (bVar4 == 7) {
        serialGet7((uchar *)(uVar14 + (long)pKey1),(Mem *)&local_78);
        iVar6 = sqlite3IntFloatCompare((pMem2->u).i,local_78.r);
        uVar13 = -iVar6;
        v = 7;
LAB_0014af78:
        uVar10 = (uint)v;
        uVar12 = uVar13;
        if (uVar13 == 0) goto LAB_0014af80;
        goto LAB_0014b05f;
      }
      uVar13 = (uint)bVar4;
      if (bVar4 == 0) goto LAB_0014b023;
      switch(bVar4) {
      case 1:
        uVar7 = (ulong)*(char *)((long)pKey1 + uVar14);
        goto LAB_0014aef2;
      case 2:
        uVar8 = (long)*(char *)((long)pKey1 + uVar14) << 8;
        uVar7 = (ulong)*(byte *)((long)pKey1 + uVar14 + 1);
        break;
      case 3:
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar14 + 1) << 8 |
                (long)*(char *)((long)pKey1 + uVar14) << 0x10;
        uVar7 = (ulong)*(byte *)((long)pKey1 + uVar14 + 2);
        break;
      case 4:
        uVar8 = (ulong)*(byte *)((long)pKey1 + uVar14 + 2) << 8 |
                (long)(int)((uint)*(byte *)((long)pKey1 + uVar14) << 0x18) |
                (ulong)*(byte *)((long)pKey1 + uVar14 + 1) << 0x10;
        uVar7 = (ulong)*(byte *)((long)pKey1 + uVar14 + 3);
        break;
      case 5:
        uVar13 = *(uint *)((long)pKey1 + uVar14 + 2);
        uVar8 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18);
        uVar7 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar14),
                                           *(undefined1 *)((long)pKey1 + uVar14 + 1)) << 0x20;
        break;
      case 6:
        uVar7 = *(ulong *)((long)pKey1 + uVar14);
        uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38;
        goto LAB_0014aef2;
      default:
        uVar7 = (ulong)(bVar4 - 8);
        goto LAB_0014aef2;
      }
      uVar7 = uVar7 | uVar8;
LAB_0014aef2:
      uVar13 = (uint)bVar4;
      if ((long)uVar7 < (pMem2->u).i) {
LAB_0014b05c:
        uVar10 = uVar13;
        uVar12 = 0xffffffff;
LAB_0014b05f:
        bVar16 = uVar10 == 0;
LAB_0014b065:
        bVar4 = pPKey2->pKeyInfo->aSortFlags[local_b0 & 0xffffffff];
        if (bVar4 == 0) goto LAB_0014b09b;
        if ((bVar4 & 2) != 0) {
          if (bVar16) {
            uVar5 = 1;
          }
          else {
            uVar5 = pMem2->flags & 1;
          }
          if ((bVar4 & 1) == uVar5) goto LAB_0014b09b;
        }
        uVar12 = -uVar12;
        goto LAB_0014b09b;
      }
      if ((pMem2->u).i < (long)uVar7) {
        uVar12 = 1;
        goto LAB_0014b05f;
      }
LAB_0014af80:
      local_b0 = local_b0 + 1;
      if (local_b0 == pPKey2->nField) {
LAB_0014afdf:
        pPKey2->eqSeen = '\x01';
        uVar12 = (uint)pPKey2->default_rc;
        goto LAB_0014b09b;
      }
      if ((uint)v < 0x80) {
        uVar13 = (uint)""[v];
      }
      else {
        uVar13 = (uint)v - 0xc >> 1;
      }
      uVar15 = uVar15 + uVar13;
      if ((uint)nKey1 < uVar15) goto LAB_0014afdf;
      iVar6 = sqlite3VarintLen(v);
      uVar11 = uVar11 + iVar6;
      if (uVar9 <= uVar11) goto LAB_0014aff1;
      pMem2 = pMem2 + 1;
    } while( true );
  }
  iVar6 = sqlite3CorruptError(0x15efe);
  pPKey2->errCode = (u8)iVar6;
LAB_0014aba1:
  uVar12 = 0;
LAB_0014b09b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar12;
LAB_0014aff1:
  iVar6 = 0x15fa0;
LAB_0014aff6:
  iVar6 = sqlite3CorruptError(iVar6);
  pPKey2->errCode = (u8)iVar6;
  goto LAB_0014aba1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        serialGet7(&aKey1[d1], &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numeric values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        if( serial_type==7 ){
          if( serialGet7(&aKey1[d1], &mem1) ){
            rc = -1;  /* mem1 is a NaN */
          }else if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }else{
            assert( rc==0 );
          }
        }else{
          sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      if( serial_type==0
       || serial_type==10
       || (serial_type==7 && serialGet7(&aKey1[d1], &mem1)!=0)
      ){
        assert( rc==0 );
      }else{
        rc = 1;
      }
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}